

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool google::protobuf::internal::cpp::IsStringFieldWithPrivatizedAccessors(FieldDescriptor *field)

{
  bool bVar1;
  ConstType pCVar2;
  
  if (((field->type_ == '\f') || (field->type_ == '\t')) &&
     (pCVar2 = FeatureSet::
               GetExtension<google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false,_0>
                         (field->merged_features_,
                          (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                           *)&pb::cpp), (pCVar2->field_0)._impl_.string_type_ == 2)) {
    if (field->type_ != '\f') {
      return true;
    }
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      return true;
    }
    if ((field->field_0x1 & 8) != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool IsStringFieldWithPrivatizedAccessors(const FieldDescriptor& field) {
  // In open-source, protobuf CORD is only supported for singular bytes
  // fields.
  if (field.cpp_type() == FieldDescriptor::CPPTYPE_STRING &&
      InternalFeatureHelper::GetFeatures(field)
              .GetExtension(pb::cpp)
              .string_type() == pb::CppFeatures::CORD &&
      (field.type() != FieldDescriptor::TYPE_BYTES || field.is_repeated() ||
       field.is_extension())
  ) {
    return true;
  }

  return false;
}